

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryMkdir(DiskHandle *this,PathPtr path,WriteMode mode,bool noThrow)

{
  String *pSVar1;
  bool bVar2;
  int code;
  WriteMode WVar3;
  size_t sVar4;
  PathPtr PVar5;
  Fault local_160;
  Fault f;
  undefined1 auStack_130 [4];
  int error_1;
  String *local_128;
  stat *local_120;
  int local_114;
  undefined1 local_110 [4];
  int _kjSyscallError_1;
  stat stats;
  int error;
  anon_class_24_3_97e79c68 local_68;
  int local_50;
  mode_t local_4c;
  int _kjSyscallError;
  mode_t acl;
  String filename;
  bool noThrow_local;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  filename.content.disposer._3_1_ = noThrow;
  filename.content.disposer._4_4_ = mode;
  PathPtr::toString((String *)&_kjSyscallError,(PathPtr *)&this_local,false);
  bVar2 = has<kj::WriteMode,void>(filename.content.disposer._4_4_,PRIVATE);
  local_4c = 0x1ff;
  if (bVar2) {
    local_4c = 0x1c0;
  }
  local_68.acl = &local_4c;
  local_68.this = this;
  local_68.filename = (String *)&_kjSyscallError;
  code = _::Debug::
         syscallError<kj::(anonymous_namespace)::DiskHandle::tryMkdir(kj::PathPtr,kj::WriteMode,bool)const::_lambda()_1_>
                   (&local_68,false);
  local_50 = code;
  if (code == 0) {
    path_local.parts.size_._7_1_ = true;
    goto LAB_0060c2f9;
  }
  if (code == 2) {
    bVar2 = has<kj::WriteMode,void>(filename.content.disposer._4_4_,CREATE_PARENT);
    if ((bVar2) && (sVar4 = PathPtr::size((PathPtr *)&this_local), sVar4 != 0)) {
      PVar5 = PathPtr::parent((PathPtr *)&this_local);
      WVar3 = operator|(CREATE,MODIFY);
      WVar3 = operator|(WVar3,CREATE_PARENT);
      bVar2 = tryMkdir(this,PVar5,WVar3,true);
      pSVar1 = path_local.parts.ptr;
      if (bVar2) {
        f.exception = (Exception *)this_local;
        WVar3 = operator-(filename.content.disposer._4_4_,CREATE_PARENT);
        PVar5.parts.size_ = (size_t)pSVar1;
        PVar5.parts.ptr = &(f.exception)->ownFile;
        path_local.parts.size_._7_1_ =
             tryMkdir(this,PVar5,WVar3,(bool)(filename.content.disposer._3_1_ & 1));
        goto LAB_0060c2f9;
      }
    }
  }
  else if (code == 0x11) {
    bVar2 = has<kj::WriteMode,void>(filename.content.disposer._4_4_,MODIFY);
    if (!bVar2) {
      path_local.parts.size_._7_1_ = false;
      goto LAB_0060c2f9;
    }
    local_128 = (String *)&_kjSyscallError;
    local_120 = (stat *)local_110;
    _auStack_130 = this;
    local_114 = _::Debug::
                syscallError<kj::(anonymous_namespace)::DiskHandle::tryMkdir(kj::PathPtr,kj::WriteMode,bool)const::_lambda()_2_>
                          ((anon_class_24_3_ec9b707d *)auStack_130,false);
    if (local_114 == 0) {
      path_local.parts.size_._7_1_ = ((uint)stats.st_nlink & 0xf000) == 0x4000;
      goto LAB_0060c2f9;
    }
  }
  if ((filename.content.disposer._3_1_ & 1) == 0) {
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x35b,code,"mkdirat(fd, path)","path",(PathPtr *)&this_local);
    _::Debug::Fault::fatal(&local_160);
  }
  path_local.parts.size_._7_1_ = false;
LAB_0060c2f9:
  stats.__glibc_reserved[2]._4_4_ = 1;
  String::~String((String *)&_kjSyscallError);
  return (bool)(path_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryMkdir(PathPtr path, WriteMode mode, bool noThrow) const {
    // Internal function to make a directory.

    auto filename = path.toString();
    mode_t acl = has(mode, WriteMode::PRIVATE) ? 0700 : 0777;

    KJ_SYSCALL_HANDLE_ERRORS(mkdirat(fd, filename.cStr(), acl)) {
      case EEXIST: {
        // Apparently this path exists.
        if (!has(mode, WriteMode::MODIFY)) {
          // Require exclusive create.
          return false;
        }

        // MODIFY is allowed, so we just need to check whether the existing entry is a directory.
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, filename.cStr(), &stats, 0)) {
          default:
            // mkdir() says EEXIST but we can't stat it. Maybe it's a dangling link, or maybe
            // we can't access it for some reason. Assume failure.
            //
            // TODO(someday): Maybe we should be creating the directory at the target of the
            //   link?
            goto failed;
        }
        return (stats.st_mode & S_IFMT) == S_IFDIR;
      }
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
            tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                    WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          return tryMkdir(path, mode - WriteMode::CREATE_PARENT, noThrow);
        } else {
          goto failed;
        }
      default:
      failed:
        if (noThrow) {
          // Caller requested no throwing.
          return false;
        } else {
          KJ_FAIL_SYSCALL("mkdirat(fd, path)", error, path);
        }
    }

    return true;
  }